

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O2

int ffgnky(fitsfile *fptr,char *card,int *status)

{
  LONGLONG *pLVar1;
  FITSfile *pFVar2;
  long bytepos;
  int iVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  char message [81];
  
  if (*status < 1) {
    if (fptr->HDUposition != fptr->Fptr->curhdu) {
      ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    }
    *card = '\0';
    pFVar2 = fptr->Fptr;
    bytepos = pFVar2->nextkey;
    lVar6 = pFVar2->datastart + -0xb40;
    if (lVar6 < pFVar2->headend) {
      lVar6 = pFVar2->headend;
    }
    if ((lVar6 < bytepos) || (bytepos < pFVar2->headstart[pFVar2->curhdu])) {
      snprintf(message,0x51,"Cannot get keyword number %d.  It does not exist.",
               (ulong)((int)((bytepos - pFVar2->headstart[pFVar2->curhdu]) / 0x50) + 1));
      ffpmsg(message);
      *status = 0xcb;
      iVar3 = 0xcb;
    }
    else {
      ffmbyt(fptr,bytepos,0,status);
      card[0x50] = '\0';
      iVar3 = ffgbyt(fptr,0x50,card,status);
      if (iVar3 < 1) {
        pLVar1 = &fptr->Fptr->nextkey;
        *pLVar1 = *pLVar1 + 0x50;
        for (uVar5 = 0x4f;
            (uVar4 = 0xffffffff, -1 < (int)uVar5 && (uVar4 = uVar5, card[uVar5] == ' '));
            uVar5 = uVar5 - 1) {
        }
        card[(long)(int)uVar4 + 1] = '\0';
      }
      iVar3 = *status;
    }
    return iVar3;
  }
  return *status;
}

Assistant:

int ffgnky(fitsfile *fptr,  /* I - FITS file pointer     */
           char *card,      /* O - card string           */
           int *status)     /* IO - error status         */
/*
  read the next keyword from the header - used internally by cfitsio
*/
{
    int jj, nrec;
    LONGLONG bytepos, endhead;
    char message[FLEN_ERRMSG];

    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    card[0] = '\0';  /* make sure card is terminated, even affer read error */

/*
  Check that nextkey points to a legal keyword position.  Note that headend
  is the current end of the header, i.e., the position where a new keyword
  would be appended, however, if there are more than 1 FITS block worth of
  blank keywords at the end of the header (36 keywords per 2880 byte block)
  then the actual physical END card must be located at a starting position
  which is just 2880 bytes prior to the start of the data unit.
*/

    bytepos = (fptr->Fptr)->nextkey;
    endhead = maxvalue( ((fptr->Fptr)->headend), ((fptr->Fptr)->datastart - 2880) );

    /* nextkey must be < endhead and > than  headstart */
    if (bytepos > endhead ||  
        bytepos < (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu] ) 
    {
        nrec= (int) ((bytepos - (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu]) / 80 + 1);
        snprintf(message, FLEN_ERRMSG,"Cannot get keyword number %d.  It does not exist.",
                nrec);
        ffpmsg(message);
        return(*status = KEY_OUT_BOUNDS);
    }
      
    ffmbyt(fptr, bytepos, REPORT_EOF, status);  /* move to read pos. */

    card[80] = '\0';  /* make sure card is terminate, even if ffgbyt fails */

    if (ffgbyt(fptr, 80, card, status) <= 0) 
    {
        (fptr->Fptr)->nextkey += 80;   /* increment pointer to next keyword */

        /* strip off trailing blanks with terminated string */
        jj = 79;
        while (jj >= 0 && card[jj] == ' ')
               jj--;

        card[jj + 1] = '\0';
    }
    return(*status);
}